

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LookUpTableQuantizationParams * __thiscall
CoreML::Specification::QuantizationParams::mutable_lookuptablequantization(QuantizationParams *this)

{
  bool bVar1;
  LookUpTableQuantizationParams *this_00;
  QuantizationParams *this_local;
  
  bVar1 = has_lookuptablequantization(this);
  if (!bVar1) {
    clear_QuantizationType(this);
    set_has_lookuptablequantization(this);
    this_00 = (LookUpTableQuantizationParams *)operator_new(0x28);
    LookUpTableQuantizationParams::LookUpTableQuantizationParams(this_00);
    (this->QuantizationType_).lookuptablequantization_ = this_00;
  }
  return (LookUpTableQuantizationParams *)(this->QuantizationType_).linearquantization_;
}

Assistant:

inline ::CoreML::Specification::LookUpTableQuantizationParams* QuantizationParams::mutable_lookuptablequantization() {
  if (!has_lookuptablequantization()) {
    clear_QuantizationType();
    set_has_lookuptablequantization();
    QuantizationType_.lookuptablequantization_ = new ::CoreML::Specification::LookUpTableQuantizationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.QuantizationParams.lookupTableQuantization)
  return QuantizationType_.lookuptablequantization_;
}